

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O1

void __thiscall libDAI::HAK::constructMessages(HAK *this)

{
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *pvVar1;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *this_00;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  long lVar3;
  ulong uVar4;
  TFactor<double> local_68;
  
  pvVar1 = &this->_Qa;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::_M_erase_at_end
            (pvVar1,(this->_Qa).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (pvVar1,*(long *)(CONCAT44(extraout_var,iVar2) + 0xe8) -
                    *(long *)(CONCAT44(extraout_var,iVar2) + 0xe0) >> 6);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  if (*(long *)(CONCAT44(extraout_var_00,iVar2) + 0xe8) !=
      *(long *)(CONCAT44(extraout_var_00,iVar2) + 0xe0)) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::TFactor
                (&local_68,(VarSet *)(*(long *)(CONCAT44(extraout_var_01,iVar2) + 0xe0) + lVar3));
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)pvVar1,
                 &local_68);
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar4 = uVar4 + 1;
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar3 = lVar3 + 0x40;
    } while (uVar4 < (ulong)(*(long *)(CONCAT44(extraout_var_02,iVar2) + 0xe8) -
                             *(long *)(CONCAT44(extraout_var_02,iVar2) + 0xe0) >> 6));
  }
  pvVar1 = &this->_Qb;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::_M_erase_at_end
            (pvVar1,(this->_Qb).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (pvVar1,(*(long *)(CONCAT44(extraout_var_03,iVar2) + 0x100) -
                     *(long *)(CONCAT44(extraout_var_03,iVar2) + 0xf8) >> 3) * -0x3333333333333333);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  if (*(long *)(CONCAT44(extraout_var_04,iVar2) + 0x100) !=
      *(long *)(CONCAT44(extraout_var_04,iVar2) + 0xf8)) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::TFactor
                (&local_68,(VarSet *)(*(long *)(CONCAT44(extraout_var_05,iVar2) + 0xf8) + lVar3));
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)pvVar1,
                 &local_68);
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar4 = uVar4 + 1;
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < (ulong)((*(long *)(CONCAT44(extraout_var_06,iVar2) + 0x100) -
                              *(long *)(CONCAT44(extraout_var_06,iVar2) + 0xf8) >> 3) *
                            -0x3333333333333333));
  }
  pvVar1 = &this->_muab;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::_M_erase_at_end
            (pvVar1,(this->_muab).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (pvVar1,*(long *)(CONCAT44(extraout_var_07,iVar2) + 0x118) -
                    *(long *)(CONCAT44(extraout_var_07,iVar2) + 0x110) >> 4);
  this_00 = &this->_muba;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::_M_erase_at_end
            (this_00,(this->_muba).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (this_00,*(long *)(CONCAT44(extraout_var_08,iVar2) + 0x118) -
                     *(long *)(CONCAT44(extraout_var_08,iVar2) + 0x110) >> 4);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar3 = *(long *)(CONCAT44(extraout_var_09,iVar2) + 0x110);
  iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  if (lVar3 != *(long *)(CONCAT44(extraout_var_10,iVar2) + 0x118)) {
    do {
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::TFactor
                (&local_68,
                 (VarSet *)
                 (*(long *)(lVar3 + 8) * 0x28 + *(long *)(CONCAT44(extraout_var_11,iVar2) + 0xf8)));
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)pvVar1,
                 &local_68);
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::TFactor
                (&local_68,
                 (VarSet *)
                 (*(long *)(lVar3 + 8) * 0x28 + *(long *)(CONCAT44(extraout_var_12,iVar2) + 0xf8)));
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)this_00,
                 &local_68);
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar3 = lVar3 + 0x10;
      iVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    } while (lVar3 != *(long *)(CONCAT44(extraout_var_13,iVar2) + 0x118));
  }
  return;
}

Assistant:

void HAK::constructMessages() {
        // Create outer beliefs
        _Qa.clear();
        _Qa.reserve(grm().nr_ORs());
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa.push_back( Factor( grm().OR(alpha).vars() ) );

        // Create inner beliefs
        _Qb.clear();
        _Qb.reserve(grm().nr_IRs());
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            _Qb.push_back( Factor( grm().IR(beta) ) );
        
        // Create messages
        _muab.clear();
        _muab.reserve(grm().nr_Redges());
        _muba.clear();
        _muba.reserve(grm().nr_Redges());
        for( vector<RegionGraph::R_edge_t>::const_iterator ab = grm().Redges().begin(); ab != grm().Redges().end(); ab++ ) {
            _muab.push_back( Factor( grm().IR(ab->second) ) );
            _muba.push_back( Factor( grm().IR(ab->second) ) );
        }
    }